

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O3

void fiobj_free(FIOBJ o)

{
  int *piVar1;
  undefined1 uVar2;
  fiobj_object_vtable_s *pfVar3;
  uintptr_t uVar4;
  uint uVar5;
  undefined1 *puVar6;
  
  uVar5 = (uint)o & 6;
  if (((uVar5 == 6) || (o == 0)) || ((o & 1) != 0)) {
    return;
  }
  puVar6 = (undefined1 *)(o & 0xfffffffffffffff8);
  LOCK();
  piVar1 = (int *)(puVar6 + 4);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return;
  }
  if ((o & 6) == 0) {
    switch(*puVar6) {
    case 0x27:
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_00160ddd_caseD_28;
    case 0x29:
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_00160ddd_caseD_2a;
    case 0x2b:
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar5 == 2) {
switchD_00160ddd_caseD_28:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_00160ddd_caseD_2a:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
  }
  if (pfVar3->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
    if ((o & 6) == 0) {
      switch(*puVar6) {
      case 0x27:
        pfVar3 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        goto switchD_00160e28_caseD_28;
      case 0x29:
        pfVar3 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        goto switchD_00160e28_caseD_2a;
      case 0x2b:
        pfVar3 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar3 = &FIOBJECT_VTABLE_NUMBER;
      }
    }
    else if (uVar5 == 2) {
switchD_00160e28_caseD_28:
      pfVar3 = &FIOBJECT_VTABLE_STRING;
    }
    else {
switchD_00160e28_caseD_2a:
      pfVar3 = &FIOBJECT_VTABLE_HASH;
    }
    uVar4 = (*pfVar3->count)(o);
    if (uVar4 != 0) {
      fiobj_free_complex_object(o);
      return;
    }
  }
  switch(uVar5) {
  case 0:
    uVar2 = *puVar6;
    break;
  case 2:
    goto switchD_00160e60_caseD_2;
  case 4:
    goto switchD_00160e60_caseD_4;
  case 6:
    uVar2 = (undefined1)o;
  }
  switch(uVar2) {
  case 0x27:
    pfVar3 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case 0x28:
switchD_00160e60_caseD_2:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case 0x29:
    pfVar3 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case 0x2a:
switchD_00160e60_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case 0x2b:
    pfVar3 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar3 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar3->dealloc)(o,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
  return;
}

Assistant:

FIO_INLINE void fiobj_free(FIOBJ o) {
  if (!FIOBJ_IS_ALLOCATED(o))
    return;
  if (fiobj_ref_dec(o))
    return;
  if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
    fiobj_free_complex_object(o);
  else
    FIOBJECT2VTBL(o)->dealloc(o, NULL, NULL);
}